

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

ON_SubDRTreeVertexFinder *
ON_SubDRTreeVertexFinder::Create
          (ON_SubDRTreeVertexFinder *__return_storage_ptr__,ON_3dPoint P,bool bMarkFilter)

{
  (__return_storage_ptr__->m_P).z = P.z;
  (__return_storage_ptr__->m_P).x = P.x;
  (__return_storage_ptr__->m_P).y = P.y;
  __return_storage_ptr__->m_distance = ON_DBL_QNAN;
  __return_storage_ptr__->m_v = (ON_SubDVertex *)0x0;
  __return_storage_ptr__->m_bMarkFilterEnabled = false;
  __return_storage_ptr__->m_bMarkFilter = false;
  __return_storage_ptr__->m_mark_bits_filter = None;
  __return_storage_ptr__->m_mark_bits = '\0';
  __return_storage_ptr__->m_reserved2 = 0;
  __return_storage_ptr__->m_bMarkFilterEnabled = true;
  __return_storage_ptr__->m_bMarkFilter = bMarkFilter;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDRTreeVertexFinder ON_SubDRTreeVertexFinder::Create(const ON_3dPoint P, bool bMarkFilter)
{
  ON_SubDRTreeVertexFinder vf = ON_SubDRTreeVertexFinder::Create(P);
  vf.m_bMarkFilterEnabled = true;
  vf.m_bMarkFilter = bMarkFilter;
  return vf;
}